

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

string * __thiscall
cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
          (string *__return_storage_ptr__,cmRuntimeDependencyArchive *this)

{
  cmMakefile *this_00;
  string *psVar1;
  allocator<char> local_39;
  string local_38;
  
  this_00 = this->Command->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL",&local_39);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool()
{
  return this->GetMakefile()->GetSafeDefinition(
    "CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL");
}